

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Print.cpp
# Opt level: O2

void __thiscall wasm::PrintSExpression::visitDataSegment(PrintSExpression *this,DataSegment *curr)

{
  Module *pMVar1;
  pointer puVar2;
  pointer pcVar3;
  Index IVar4;
  ostream *poVar5;
  char *in_RCX;
  string_view str;
  string_view str_00;
  undefined1 local_108 [176];
  _Vector_base<wasm::Walker<wasm::Measurer,_wasm::UnifiedExpressionVisitor<wasm::Measurer,_void>_>::Task,_std::allocator<wasm::Walker<wasm::Measurer,_wasm::UnifiedExpressionVisitor<wasm::Measurer,_void>_>::Task>_>
  local_58 [2];
  
  if ((curr->isPassive == false) && (curr->offset == (Expression *)0x0)) {
    return;
  }
  doIndent(this->o,this->indent);
  std::operator<<(this->o,'(');
  str._M_str = "data ";
  str._M_len = 5;
  printMajor(this->o,str);
  Name::print((Name *)curr,this->o);
  std::operator<<(this->o,' ');
  if (curr->isPassive != false) goto LAB_00b1b9c1;
  pMVar1 = this->currModule;
  if (pMVar1 == (Module *)0x0) {
LAB_00b1b923:
    std::operator<<(this->o,"(memory ");
    Name::print(&curr->memory,this->o);
    std::operator<<(this->o,") ");
  }
  else {
    puVar2 = (pMVar1->memories).
             super__Vector_base<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if ((pMVar1->memories).
        super__Vector_base<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish == puVar2) {
      __assert_fail("!currModule || currModule->memories.size() > 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/Print.cpp"
                    ,0xd48,"void wasm::PrintSExpression::visitDataSegment(DataSegment *)");
    }
    in_RCX = (curr->memory).super_IString.str._M_str;
    if (in_RCX != *(char **)((long)&(((puVar2->_M_t).
                                      super___uniq_ptr_impl<wasm::Memory,_std::default_delete<wasm::Memory>_>
                                      ._M_t.
                                      super__Tuple_impl<0UL,_wasm::Memory_*,_std::default_delete<wasm::Memory>_>
                                      .super__Head_base<0UL,_wasm::Memory_*,_false>._M_head_impl)->
                                    super_Importable).super_Named + 8)) goto LAB_00b1b923;
  }
  memset(local_108,0,0xdc);
  IVar4 = Measurer::measure(curr->offset);
  std::
  _Vector_base<wasm::Walker<wasm::Measurer,_wasm::UnifiedExpressionVisitor<wasm::Measurer,_void>_>::Task,_std::allocator<wasm::Walker<wasm::Measurer,_wasm::UnifiedExpressionVisitor<wasm::Measurer,_void>_>::Task>_>
  ::~_Vector_base(local_58);
  if (IVar4 < 2) {
    visit(this,curr->offset);
  }
  else {
    std::operator<<(this->o,"(offset ");
    visit(this,curr->offset);
    std::operator<<(this->o,")");
  }
  std::operator<<(this->o,' ');
LAB_00b1b9c1:
  pcVar3 = (curr->data).super__Vector_base<char,_std::allocator<char>_>._M_impl.
           super__Vector_impl_data._M_start;
  str_00._M_str = in_RCX;
  str_00._M_len = (size_t)pcVar3;
  String::printEscaped
            ((String *)this->o,
             (ostream *)
             ((curr->data).super__Vector_base<char,_std::allocator<char>_>._M_impl.
              super__Vector_impl_data._M_finish + -(long)pcVar3),str_00);
  poVar5 = std::operator<<(this->o,')');
  std::operator<<(poVar5,this->maybeNewLine);
  return;
}

Assistant:

void PrintSExpression::visitDataSegment(DataSegment* curr) {
  if (!curr->isPassive && !curr->offset) {
    // This data segment must have been created from the datacount section but
    // not parsed yet. Skip it.
    return;
  }
  doIndent(o, indent);
  o << '(';
  printMajor(o, "data ");
  curr->name.print(o);
  o << ' ';
  if (!curr->isPassive) {
    assert(!currModule || currModule->memories.size() > 0);
    if (!currModule || curr->memory != currModule->memories[0]->name) {
      o << "(memory ";
      curr->memory.print(o);
      o << ") ";
    }
    bool needExplicitOffset = Measurer{}.measure(curr->offset) > 1;
    if (needExplicitOffset) {
      o << "(offset ";
    }
    visit(curr->offset);
    if (needExplicitOffset) {
      o << ")";
    }
    o << ' ';
  }
  String::printEscaped(o, {curr->data.data(), curr->data.size()});
  o << ')' << maybeNewLine;
}